

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O2

compile_errcode __thiscall
ValueArgumentList::Action
          (ValueArgumentList *this,vector<_SymbolType,_std::allocator<_SymbolType>_> *argument_type)

{
  SymbolName SVar1;
  compile_errcode cVar2;
  int iVar3;
  SymbolType expression_type;
  
  iVar3 = 0;
LAB_001385f9:
  do {
    SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
    if (iVar3 != 2) {
      if (iVar3 == 1) {
        if (SVar1 != COMMA_SYM) {
          return 0;
        }
        SymbolQueue::NextSymbol(handle_correct_queue);
        iVar3 = 2;
        goto LAB_001385f9;
      }
      if (SVar1 == R_CIRCLE_BRACKET_SYM) {
        return 0;
      }
    }
    cVar2 = Expression::Action(&this->m_expression,&expression_type);
    if (cVar2 != 0) {
      return -1;
    }
    std::vector<_SymbolType,_std::allocator<_SymbolType>_>::push_back
              (argument_type,&expression_type);
    iVar3 = 1;
  } while( true );
}

Assistant:

compile_errcode ValueArgumentList::Action(vector<SymbolType>& argument_type) {
    int ret = COMPILE_OK;
    int state = 0;
    SymbolType expression_type;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    return COMPILE_OK;
                } else if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    argument_type.push_back(expression_type);
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == COMMA_SYM) {
                    state = 2;
                    break;
                } else {
                    return COMPILE_OK;
                }
            }
            case 2: {
                if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    argument_type.push_back(expression_type);
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
        }
        if (state != 1)
            handle_correct_queue->NextSymbol();
    }
}